

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptTessellationDeclType(HlslGrammar *this,TBuiltInVariable *patchType)

{
  EHlslTokenClass EVar1;
  TBuiltInVariable TVar2;
  
  EVar1 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  if (EVar1 == EHTokInputPatch) {
    TVar2 = EbvInputPatch;
  }
  else {
    if (EVar1 != EHTokOutputPatch) {
      return false;
    }
    TVar2 = EbvOutputPatch;
  }
  *patchType = TVar2;
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  return true;
}

Assistant:

bool HlslGrammar::acceptTessellationDeclType(TBuiltInVariable& patchType)
{
    // read geometry type
    const EHlslTokenClass tessType = peek();

    switch (tessType) {
    case EHTokInputPatch:    patchType = EbvInputPatch;  break;
    case EHTokOutputPatch:   patchType = EbvOutputPatch; break;
    default:
        return false;  // not a tessellation decl
    }

    advanceToken();  // consume the keyword
    return true;
}